

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App_inl.hpp
# Opt level: O2

bool __thiscall CLI::App::_process_config_file(App *this,string *config_file,bool throw_error)

{
  path_type pVar1;
  bool bVar2;
  FileError *__return_storage_ptr__;
  vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> values;
  string local_40;
  
  pVar1 = detail::check_path((config_file->_M_dataplus)._M_p);
  if (pVar1 == file) {
    Config::from_file(&values,(this->config_formatter_).
                              super___shared_ptr<CLI::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                      config_file);
    _parse_config(this,&values);
    std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::~vector(&values);
    bVar2 = true;
  }
  else {
    if (throw_error) {
      __return_storage_ptr__ = (FileError *)__cxa_allocate_exception(0x38);
      ::std::__cxx11::string::string((string *)&local_40,(string *)config_file);
      FileError::Missing(__return_storage_ptr__,&local_40);
      __cxa_throw(__return_storage_ptr__,&FileError::typeinfo,Error::~Error);
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

CLI11_INLINE bool App::_process_config_file(const std::string &config_file, bool throw_error) {
    auto path_result = detail::check_path(config_file.c_str());
    if(path_result == detail::path_type::file) {
        try {
            std::vector<ConfigItem> values = config_formatter_->from_file(config_file);
            _parse_config(values);
            return true;
        } catch(const FileError &) {
            if(throw_error) {
                throw;
            }
            return false;
        }
    } else if(throw_error) {
        throw FileError::Missing(config_file);
    } else {
        return false;
    }
}